

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_onewaycouple_mri.c
# Opt level: O2

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  
  pdVar1 = *(double **)((long)y->content + 0x10);
  pdVar2 = *(double **)((long)ydot->content + 0x10);
  dVar3 = *pdVar1;
  dVar4 = pdVar1[1];
  *pdVar2 = dVar4 * -50.0;
  pdVar2[1] = dVar3 * 50.0;
  pdVar2[2] = dVar4 + dVar3;
  return 0;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype c1 = SUN_RCONST(50.0); /* problem constant */
  sunrealtype u  = NV_Ith_S(y, 0);   /* access solution values */
  sunrealtype v  = NV_Ith_S(y, 1);

  /* fill in the RHS function */
  NV_Ith_S(ydot, 0) = -c1 * v;
  NV_Ith_S(ydot, 1) = c1 * u;
  NV_Ith_S(ydot, 2) = u + v;

  /* Return with success */
  return 0;
}